

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gameplay.cpp
# Opt level: O2

void __thiscall Gameplay::ArrangeTurns(Gameplay *this)

{
  int iVar1;
  int iVar2;
  Gameplay *pGVar3;
  Gameplay *pGVar4;
  Gameplay *pGVar5;
  
  pGVar5 = this;
  while( true ) {
    pGVar4 = (Gameplay *)
             (pGVar5->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node.
             super__List_node_base._M_next;
    (this->it)._M_node = (_List_node_base *)pGVar4;
    pGVar5 = pGVar4;
    if (pGVar4 == this) break;
    for (; pGVar4 != this;
        pGVar4 = (Gameplay *)
                 (pGVar4->players).super__List_base<Player,_std::allocator<Player>_>._M_impl._M_node
                 .super__List_node_base._M_next) {
      iVar1 = Player::getHonour((Player *)
                                &(pGVar4->players).super__List_base<Player,_std::allocator<Player>_>
                                 ._M_impl._M_node._M_size);
      iVar2 = Player::getHonour((Player *)
                                &(pGVar5->players).super__List_base<Player,_std::allocator<Player>_>
                                 ._M_impl._M_node._M_size);
      pGVar3 = pGVar4;
      if (iVar1 <= iVar2) {
        pGVar3 = pGVar5;
      }
      pGVar5 = pGVar3;
    }
    (this->it)._M_node = (_List_node_base *)pGVar5;
  }
  return;
}

Assistant:

void Gameplay::ArrangeTurns()                                   //selection sorting in decreasing order players list by honour
{
    list <Player>::iterator max, i;

    for (it=players.begin(); it!=players.end(); it++)
    {
        max = it;
        for (i=it; i!=players.end(); i++)
        {
            if (i->getHonour() > max->getHonour())
                max = i;
        }
        swap(--it, max);
    }
}